

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O2

ostream * tchecker::parsing::operator<<(ostream *os,attributes_t *attr)

{
  __node_base *p_Var1;
  __node_base *p_Var2;
  
  if ((attr->_attr)._M_h._M_element_count != 0) {
    std::operator<<(os,"{");
    p_Var2 = &(attr->_attr)._M_h._M_before_begin;
    p_Var1 = p_Var2;
    while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
      if (p_Var1 != p_Var2->_M_nxt) {
        std::operator<<(os," : ");
      }
      operator<<(os,(attr_t *)p_Var1[5]._M_nxt);
    }
    std::operator<<(os,"}");
  }
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, tchecker::parsing::attributes_t const & attr)
{
  if (attr.size() == 0)
    return os;

  os << "{";
  for (auto it = attr.begin(); it != attr.end(); ++it) {
    if (it != attr.begin())
      os << " : ";
    os << *it;
  }
  os << "}";
  return os;
}